

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::internal::MatcherBase<const_google::protobuf::Map<bool,_bool>_&>::~MatcherBase
          (MatcherBase<const_google::protobuf::Map<bool,_bool>_&> *this)

{
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }